

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsPrimaryTypes.cpp
# Opt level: O1

void helics::valueExtract
               (defV *data,vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *val
               )

{
  pointer *ppcVar1;
  iterator __position;
  pointer pcVar2;
  undefined8 uVar3;
  variant_alternative_t<0UL,_variant<double,_long,_basic_string<char,_char_traits<char>,_allocator<char>_>,_complex<double>,_vector<double,_allocator<double>_>,_vector<complex<double>,_allocator<complex<double>_>_>,_NamedPoint>_>
  *__args;
  variant_alternative_t<3UL,_variant<double,_long,_basic_string<char,_char_traits<char>,_allocator<char>_>,_complex<double>,_vector<double,_allocator<double>_>,_vector<complex<double>,_allocator<complex<double>_>_>,_NamedPoint>_>
  *__args_00;
  variant_alternative_t<6UL,_variant<double,_long,_basic_string<char,_char_traits<char>,_allocator<char>_>,_complex<double>,_vector<double,_allocator<double>_>,_vector<complex<double>,_allocator<complex<double>_>_>,_NamedPoint>_>
  *pvVar4;
  variant_alternative_t<2UL,_variant<double,_long,_basic_string<char,_char_traits<char>,_allocator<char>_>,_complex<double>,_vector<double,_allocator<double>_>,_vector<complex<double>,_allocator<complex<double>_>_>,_NamedPoint>_>
  *pvVar5;
  variant_alternative_t<1UL,_variant<double,_long,_basic_string<char,_char_traits<char>,_allocator<char>_>,_complex<double>,_vector<double,_allocator<double>_>,_vector<complex<double>,_allocator<complex<double>_>_>,_NamedPoint>_>
  *pvVar6;
  variant_alternative_t<4UL,_variant<double,_long,_basic_string<char,_char_traits<char>,_allocator<char>_>,_complex<double>,_vector<double,_allocator<double>_>,_vector<complex<double>,_allocator<complex<double>_>_>,_NamedPoint>_>
  *pvVar7;
  ulong uVar8;
  variant_alternative_t<5UL,_variant<double,_long,_basic_string<char,_char_traits<char>,_allocator<char>_>,_complex<double>,_vector<double,_allocator<double>_>,_vector<complex<double>,_allocator<complex<double>_>_>,_NamedPoint>_>
  *__x;
  uint *puVar9;
  pointer pdVar10;
  pointer pdVar11;
  ulong uVar12;
  long lVar13;
  string_view val_00;
  string_view val_01;
  vector<std::complex<double>,_std::allocator<std::complex<double>_>_> local_40;
  double local_28;
  
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::resize(val,0);
  puVar9 = &switchD_0020517a::switchdataD_003dcf7c;
  switch((data->
         super__Variant_base<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
         ).
         super__Move_assign_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
         .
         super__Copy_assign_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
         .
         super__Move_ctor_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
         .
         super__Copy_ctor_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
         .
         super__Variant_storage_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
         ._M_index) {
  case '\0':
    __args = std::
             get<0ul,double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
                       (data);
    goto LAB_002052ea;
  case '\x01':
    pvVar6 = std::
             get<1ul,double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
                       (data);
    local_40.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)(double)*pvVar6;
    local_28 = 0.0;
    std::vector<std::complex<double>,std::allocator<std::complex<double>>>::
    emplace_back<double,double>
              ((vector<std::complex<double>,std::allocator<std::complex<double>>> *)val,
               (double *)&local_40,&local_28);
    break;
  default:
    pvVar5 = std::
             get<2ul,double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
                       (data);
    val_01._M_str = (pvVar5->_M_dataplus)._M_p;
    val_01._M_len = pvVar5->_M_string_length;
    helicsGetComplexVector(val_01,val);
    return;
  case '\x03':
    __args_00 = std::
                get<3ul,double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
                          (data);
    __position._M_current =
         (val->super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (val->super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>).
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<std::complex<double>,std::allocator<std::complex<double>>>::
      _M_realloc_insert<std::complex<double>const&>
                ((vector<std::complex<double>,std::allocator<std::complex<double>>> *)val,__position
                 ,__args_00);
      return;
    }
    uVar3 = *(undefined8 *)(__args_00->_M_value + 8);
    *(undefined8 *)(__position._M_current)->_M_value = *(undefined8 *)__args_00->_M_value;
    *(undefined8 *)((__position._M_current)->_M_value + 8) = uVar3;
    ppcVar1 = &(val->
               super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>).
               _M_impl.super__Vector_impl_data._M_finish;
    *ppcVar1 = *ppcVar1 + 1;
    break;
  case '\x04':
    pvVar7 = std::
             get<4ul,double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
                       (data);
    std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::reserve
              (val,(long)(pvVar7->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)(pvVar7->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                         super__Vector_impl_data._M_start >> 3);
    pcVar2 = (val->super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>)
             ._M_impl.super__Vector_impl_data._M_start;
    if ((val->super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>).
        _M_impl.super__Vector_impl_data._M_finish != pcVar2) {
      (val->super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>).
      _M_impl.super__Vector_impl_data._M_finish = pcVar2;
    }
    pdVar10 = (pvVar7->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_start;
    pdVar11 = (pvVar7->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_finish;
    uVar8 = (long)pdVar11 - (long)pdVar10;
    if (uVar8 != 8) {
      lVar13 = 8;
      uVar12 = 0;
      do {
        std::vector<std::complex<double>,std::allocator<std::complex<double>>>::
        emplace_back<double_const&,double_const&>
                  ((vector<std::complex<double>,std::allocator<std::complex<double>>> *)val,
                   (double *)((long)pdVar10 + lVar13 + -8),(double *)((long)pdVar10 + lVar13));
        uVar12 = uVar12 + 2;
        pdVar10 = (pvVar7->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        pdVar11 = (pvVar7->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data._M_finish;
        uVar8 = (long)pdVar11 - (long)pdVar10;
        lVar13 = lVar13 + 0x10;
      } while (uVar12 < ((long)uVar8 >> 3) - 1U);
    }
    if ((uVar8 & 8) == 0) {
      return;
    }
    __args = pdVar11 + -1;
LAB_002052ea:
    local_40.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    std::vector<std::complex<double>,std::allocator<std::complex<double>>>::
    emplace_back<double_const&,double>
              ((vector<std::complex<double>,std::allocator<std::complex<double>>> *)val,__args,
               (double *)&local_40);
    break;
  case '\x05':
    __x = std::
          get<5ul,double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
                    (data);
    std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::operator=(val,__x);
    return;
  case '\x06':
    pvVar4 = std::
             get<6ul,double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
                       (data);
    if (NAN(pvVar4->value)) {
      val_00._M_str = (char *)puVar9;
      val_00._M_len = (size_t)(pvVar4->name)._M_dataplus._M_p;
      helicsGetComplexVector(&local_40,(helics *)(pvVar4->name)._M_string_length,val_00);
      CLI::std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::_M_move_assign
                ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)val,
                 &local_40);
      if (local_40.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_40.
                        super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_40.
                              super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_40.
                              super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
    }
    else {
      std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::resize(val,1);
      pcVar2 = (val->
               super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>).
               _M_impl.super__Vector_impl_data._M_start;
      *(double *)pcVar2->_M_value = pvVar4->value;
      *(undefined8 *)(pcVar2->_M_value + 8) = 0;
    }
  }
  return;
}

Assistant:

void valueExtract(const defV& data, std::vector<std::complex<double>>& val)
{
    val.resize(0);
    switch (data.index()) {
        case double_loc:  // double
            val.emplace_back(std::get<double>(data), 0.0);
            break;
        case int_loc:  // int64_t
            val.emplace_back(static_cast<double>(std::get<int64_t>(data)), 0.0);
            break;
        case string_loc:  // string
        default:
            helicsGetComplexVector(std::get<std::string>(data), val);
            break;
        case complex_loc:  // complex
        {
            val.push_back(std::get<std::complex<double>>(data));
        } break;
        case vector_loc:  // vector
        {
            const auto& vec = std::get<std::vector<double>>(data);
            val.reserve(vec.size() + 1 / 2);
            val.clear();
            for (size_t ii = 0; ii < vec.size() - 1; ii += 2) {
                val.emplace_back(vec[ii], vec[ii + 1]);
            }
            if (vec.size() % 2 == 1) {
                val.emplace_back(vec.back(), 0.0);
            }
            break;
        }
        case complex_vector_loc:  // complex
            val = std::get<std::vector<std::complex<double>>>(data);
            break;
        case named_point_loc:  // named point
        {
            const auto& point = std::get<NamedPoint>(data);
            if (std::isnan(point.value)) {
                val = helicsGetComplexVector(point.name);
            } else {
                val.resize(1);
                val[0] = std::complex<double>(point.value, 0.0);
            }
            break;
        }
    }
}